

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaWMR.cpp
# Opt level: O1

void __thiscall NaWMR::Function(NaWMR *this,NaReal *x,NaReal *y)

{
  double dVar1;
  int i;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (y != (NaReal *)0x0 && x != (NaReal *)0x0) {
    iVar2 = (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[3])();
    dVar4 = (double)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 8))
                              ((long *)CONCAT44(extraout_var,iVar2));
    dVar1 = this->cs[4];
    dVar6 = this->cs[0];
    dVar5 = cos(this->cs[2]);
    *y = dVar5 * dVar1 * dVar4 + dVar6;
    dVar1 = this->cs[4];
    dVar6 = this->cs[1];
    dVar5 = sin(this->cs[2]);
    y[1] = dVar5 * dVar1 * dVar4 + dVar6;
    y[2] = this->cs[3] * dVar4 + this->cs[2];
    dVar1 = (this->par).iz;
    dVar6 = (this->par).r;
    y[3] = (((this->cs[6] - this->cs[5]) * (this->par).l) / ((dVar6 + dVar6) * dVar1) +
           ((this->par).b * (this->par).m * this->cs[3] * this->cs[4]) / dVar1) * dVar4 +
           this->cs[3];
    y[4] = ((this->cs[6] + this->cs[5]) / ((this->par).m * (this->par).r) -
           (this->par).b * this->cs[3] * this->cs[3]) * dVar4 + this->cs[4];
    dVar1 = (this->par).Km;
    dVar6 = (this->par).l;
    dVar5 = this->cs[3] * dVar6 * 0.5;
    dVar6 = (-dVar1 * (this->par).Kw * (this->par).i) / dVar6;
    y[5] = ((dVar1 * *x + ((this->cs[4] - dVar5) * dVar6 - (this->par).R * this->cs[5])) /
           (this->par).L) * dVar4 + this->cs[5];
    y[6] = (((this->par).Km * x[1] + ((dVar5 + this->cs[4]) * dVar6 - (this->par).R * this->cs[6]))
           / (this->par).L) * dVar4 + this->cs[6];
    lVar3 = 0;
    do {
      this->cs[lVar3] = y[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
  }
  return;
}

Assistant:

void
NaWMR::Function (NaReal* x, NaReal* y)
{
  if(NULL == x || NULL == y)
    return;

#if 1
#define NEXT(id, next)	y[id] = cs[id] + dt * (next)

  NaReal	dt = Timer().GetSamplingRate();

  NEXT(x_coord,
       cs[dir_vel] * cos(cs[angle]));
  NEXT(y_coord,
       cs[dir_vel] * sin(cs[angle]));
  NEXT(angle,
       cs[angle_vel]);
  NEXT(angle_vel,
       par.b * par.m * cs[angle_vel] * cs[dir_vel]/par.iz
       + par.l * (cs[right_torque] - cs[left_torque])/(2 * par.r * par.iz));
  NEXT(dir_vel,
       - par.b * cs[angle_vel] * cs[angle_vel]
       + (cs[right_torque] + cs[left_torque])/(par.m * par.r));

  NaReal	a = par.Km * par.Kw * par.i / par.l/* or par.r ??? some m */;
  NaReal	b = cs[angle_vel] * par.l / 2;
  NEXT(left_torque,
       (- par.R * cs[left_torque]
	- a * (cs[dir_vel] - b)
	+ par.Km * x[left_volts]) / par.L);
  NEXT(right_torque,
       (- par.R * cs[right_torque]
	- a * (cs[dir_vel] + b)
	+ par.Km * x[right_volts]) / par.L);

#undef NEXT

#else

  y[x_coord] = cs[x_coord] + dt * (cs[dir_vel] * cos(cs[angle]));
  y[y_coord] = cs[y_coord] + dt * (cs[dir_vel] * sin(cs[angle]));
  y[angle] = cs[angle] + dt * cs[angle_vel];
  y[angle_vel] = cs[angle_vel]
    + dt * (par.b * par.m * cs[angle_vel] * cs[dir_vel]/par.iz
	    + (cs[right_torque] - cs[left_torque])/(2 * par.r * par.iz));
  y[dir_vel] = cs[dir_vel]
    + dt * (-par.b * cs[angle_vel] * cs[angle_vel]
	    + (cs[right_torque] + cs[left_torque])/(par.m * par.r));

  NaReal	a = par.Km * par.Kw * par.i;
  NaReal	b = cs[angle_vel] * par.l / 2;
  y[left_torque] =
    cs[left_torque] + dt * (- par.R * cs[left_torque]
			    - a * (cs[dir_vel] - b)
			    + par.Km * x[left_volts]) / par.L;
  y[right_torque] =
    cs[right_torque] + dt * (- par.R * cs[right_torque]
			     - a * (cs[dir_vel] + b)
			     + par.Km * x[right_volts]) / par.L;
#endif

  for(int i = 0; i < __state_dim; ++i)
    cs[i] = y[i];
}